

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_command_line_params.cpp
# Opt level: O0

void __thiscall crnlib::command_line_params::clear(command_line_params *this)

{
  vector<crnlib::dynamic_string> *in_RDI;
  
  vector<crnlib::dynamic_string>::clear(in_RDI);
  std::
  multimap<crnlib::dynamic_string,_crnlib::command_line_params::param_value,_std::less<crnlib::dynamic_string>,_std::allocator<std::pair<const_crnlib::dynamic_string,_crnlib::command_line_params::param_value>_>_>
  ::clear((multimap<crnlib::dynamic_string,_crnlib::command_line_params::param_value,_std::less<crnlib::dynamic_string>,_std::allocator<std::pair<const_crnlib::dynamic_string,_crnlib::command_line_params::param_value>_>_>
           *)0x117f26);
  return;
}

Assistant:

void command_line_params::clear() {
  m_params.clear();

  m_param_map.clear();
}